

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnEventType(BinaryReaderIR *this,Index index,Index sig_index)

{
  Module *this_00;
  Index index_00;
  pointer pEVar1;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> local_c0;
  Location local_b8;
  Var local_98;
  Event *local_50;
  Event *event;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> local_28;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> field;
  Index sig_index_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>.
  super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl._0_4_ = sig_index;
  field._M_t.
  super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>.
  super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl._4_4_ = index;
  GetLocation((Location *)&event,this);
  MakeUnique<wabt::EventModuleField,wabt::Location>((wabt *)&local_28,(Location *)&event);
  pEVar1 = std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
           operator->(&local_28);
  index_00 = (Index)field._M_t.
                    super___uniq_ptr_impl<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wabt::EventModuleField_*,_std::default_delete<wabt::EventModuleField>_>
                    .super__Head_base<0UL,_wabt::EventModuleField_*,_false>._M_head_impl;
  local_50 = &pEVar1->event;
  GetLocation(&local_b8,this);
  Var::Var(&local_98,index_00,&local_b8);
  SetFuncDeclaration(this,&(pEVar1->event).decl,&local_98);
  Var::~Var(&local_98);
  this_00 = this->module_;
  std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::unique_ptr
            (&local_c0,&local_28);
  Module::AppendField(this_00,&local_c0);
  std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::~unique_ptr
            (&local_c0);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::~unique_ptr
            (&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnEventType(Index index, Index sig_index) {
  auto field = MakeUnique<EventModuleField>(GetLocation());
  Event& event = field->event;
  SetFuncDeclaration(&event.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}